

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O2

void Fxch_ManComputeLevel(Fxch_Man_t *pFxchMan)

{
  Vec_Int_t *p;
  int i;
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int i_00;
  int iVar4;
  
  pVVar3 = Vec_WecEntry(pFxchMan->vCubes,0);
  i = Vec_IntEntry(pVVar3,0);
  pVVar3 = Vec_IntStart(pFxchMan->nVars);
  pFxchMan->vLevels = pVVar3;
  iVar4 = 0;
  for (i_00 = 0; i_00 < pFxchMan->vCubes->nSize; i_00 = i_00 + 1) {
    pVVar3 = Vec_WecEntry(pFxchMan->vCubes,i_00);
    iVar1 = Vec_IntEntry(pVVar3,0);
    if (i != iVar1) {
      Vec_IntAddToEntry(pFxchMan->vLevels,i,i_00 - iVar4);
      i = Vec_IntEntry(pVVar3,0);
      iVar4 = i_00;
    }
    p = pFxchMan->vLevels;
    iVar1 = Fxch_ManComputeLevelCube(pFxchMan,pVVar3);
    iVar2 = Vec_IntEntry(p,i);
    if (iVar2 < iVar1) {
      Vec_IntWriteEntry(p,i,iVar1);
    }
  }
  return;
}

Assistant:

void Fxch_ManComputeLevel( Fxch_Man_t* pFxchMan )
{
    Vec_Int_t* vCube;
    int i,
        iVar,
        iFirst = 0;

    iVar = Vec_IntEntry( Vec_WecEntry( pFxchMan->vCubes, 0 ), 0 );
    pFxchMan->vLevels = Vec_IntStart( pFxchMan->nVars );

    Vec_WecForEachLevel( pFxchMan->vCubes, vCube, i )
    {
        if ( iVar != Vec_IntEntry( vCube, 0 ) )
        {
            Vec_IntAddToEntry( pFxchMan->vLevels, iVar, i - iFirst );
            iVar = Vec_IntEntry( vCube, 0 );
            iFirst = i;
        }
        Vec_IntUpdateEntry( pFxchMan->vLevels, iVar, Fxch_ManComputeLevelCube( pFxchMan, vCube ) );
    }
}